

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_heresiarch.cpp
# Opt level: O1

int AF_A_SorcFX2Split(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  long *plVar2;
  undefined8 *puVar3;
  PClass *pPVar4;
  long lVar5;
  undefined8 uVar6;
  PClass *pPVar7;
  AActor *pAVar8;
  FState *pFVar9;
  char *__assertion;
  bool bVar10;
  FName local_48;
  FName local_44;
  DVector3 local_40;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005b8846;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    plVar2 = (long *)(param->field_0).field_1.a;
    if (plVar2 != (long *)0x0) {
      if (plVar2[1] == 0) {
        lVar5 = (**(code **)*plVar2)(plVar2);
        plVar2[1] = lVar5;
      }
      pPVar7 = (PClass *)plVar2[1];
      bVar10 = pPVar7 != (PClass *)0x0;
      if (pPVar7 != pPVar4 && bVar10) {
        do {
          pPVar7 = pPVar7->ParentClass;
          bVar10 = pPVar7 != (PClass *)0x0;
          if (pPVar7 == pPVar4) break;
        } while (pPVar7 != (PClass *)0x0);
      }
      if (!bVar10) {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005b8846;
      }
    }
    pPVar4 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
      if ((VVar1 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005b881b;
      puVar3 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar3 != (undefined8 *)0x0) {
        if (puVar3[1] == 0) {
          uVar6 = (**(code **)*puVar3)(puVar3);
          puVar3[1] = uVar6;
        }
        pPVar7 = (PClass *)puVar3[1];
        bVar10 = pPVar7 != (PClass *)0x0;
        if (pPVar7 != pPVar4 && bVar10) {
          do {
            pPVar7 = pPVar7->ParentClass;
            bVar10 = pPVar7 != (PClass *)0x0;
            if (pPVar7 == pPVar4) break;
          } while (pPVar7 != (PClass *)0x0);
        }
        if (!bVar10) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005b8846;
        }
      }
    }
    if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
       ((VVar1 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      if (plVar2[1] == 0) {
        lVar5 = (**(code **)*plVar2)(plVar2);
        plVar2[1] = lVar5;
      }
      local_40.X = (double)plVar2[9];
      local_40.Y = (double)plVar2[10];
      local_40.Z = (double)plVar2[0xb];
      pAVar8 = AActor::StaticSpawn((PClassActor *)plVar2[1],&local_40,NO_REPLACE,false);
      if (pAVar8 != (AActor *)0x0) {
        (pAVar8->target).field_0 = *(anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)(plVar2 + 0x3b)
        ;
        pAVar8->args[0] = 0;
        pAVar8->specialf1 = (double)plVar2[0x12];
        local_44.Index = FName::NameManager::FindName(&FName::NameData,"Orbit",false);
        pFVar9 = AActor::FindState(pAVar8,&local_44);
        AActor::SetState(pAVar8,pFVar9,false);
      }
      if (plVar2[1] == 0) {
        lVar5 = (**(code **)*plVar2)(plVar2);
        plVar2[1] = lVar5;
      }
      local_40.X = (double)plVar2[9];
      local_40.Y = (double)plVar2[10];
      local_40.Z = (double)plVar2[0xb];
      pAVar8 = AActor::StaticSpawn((PClassActor *)plVar2[1],&local_40,NO_REPLACE,false);
      if (pAVar8 != (AActor *)0x0) {
        (pAVar8->target).field_0 = *(anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)(plVar2 + 0x3b)
        ;
        pAVar8->args[0] = 1;
        pAVar8->specialf1 = (double)plVar2[0x12];
        local_48.Index = FName::NameManager::FindName(&FName::NameData,"Orbit",false);
        pFVar9 = AActor::FindState(pAVar8,&local_48);
        AActor::SetState(pAVar8,pFVar9,false);
      }
      (**(code **)(*plVar2 + 0x20))(plVar2);
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005b881b:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005b8846:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_heresiarch.cpp"
                ,0x2ed,"int AF_A_SorcFX2Split(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SorcFX2Split)
{
	PARAM_ACTION_PROLOGUE;

	AActor *mo;

	mo = Spawn(self->GetClass(), self->Pos(), NO_REPLACE);
	if (mo)
	{
		mo->target = self->target;
		mo->args[0] = 0;									// CW
		mo->specialf1 = self->Angles.Yaw.Degrees;			// Set angle
		mo->SetState (mo->FindState("Orbit"));
	}
	mo = Spawn(self->GetClass(), self->Pos(), NO_REPLACE);
	if (mo)
	{
		mo->target = self->target;
		mo->args[0] = 1;									// CCW
		mo->specialf1 = self->Angles.Yaw.Degrees;			// Set angle
		mo->SetState (mo->FindState("Orbit"));
	}
	self->Destroy ();
	return 0;
}